

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.hpp
# Opt level: O2

void __thiscall SymbolTable::finalize(SymbolTable *this,u8 zeroTerminated)

{
  u64 uVar1;
  ulong uVar2;
  u32 i;
  long lVar3;
  byte bVar4;
  ushort uVar5;
  u32 k;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  u64 *puVar11;
  int iVar12;
  byte local_161;
  byte local_160;
  u8 local_15f;
  byte local_15e [6];
  ulong local_158;
  ulong local_150;
  ulong local_148;
  u64 *local_140;
  byte local_138 [192];
  u8 rsum [8];
  
  uVar6 = (ulong)this->nSymbols;
  local_150 = uVar6;
  local_160 = ((char)this->nSymbols + zeroTerminated) - (char)this->lenHisto[0];
  local_15f = zeroTerminated;
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    local_15e[lVar3] = local_15e[lVar3 + 0xffffffffffffffff] + (char)this->lenHisto[lVar3 + 1];
  }
  uVar8 = (ulong)zeroTerminated;
  this->suffixLim = (ushort)zeroTerminated;
  local_138[0] = 0;
  uVar1 = this->symbols[0x100].icl;
  this->symbols[0].val = this->symbols[0x100].val;
  this->symbols[0].icl = uVar1;
  local_161 = local_15e[0];
  local_140 = &this->symbols[0x100].icl;
  local_148 = uVar8;
  local_158 = uVar6;
  for (; uVar8 < uVar6; uVar8 = uVar8 + 1) {
    uVar1 = this->symbols[uVar8 + 0x100].val.num;
    uVar2 = this->symbols[uVar8 + 0x100].icl;
    iVar12 = (int)(uVar2 >> 0x1c);
    if ((uVar2 & 0xffffffff0000000) == 0x20000000) {
      uVar7 = local_150 & 0xffffffff;
      puVar11 = local_140;
      for (uVar6 = 0; uVar6 < uVar7; uVar6 = uVar6 + 1) {
        uVar10 = uVar7;
        if ((short)uVar1 == (short)(((Symbol *)(puVar11 + -1))->val).num) {
          uVar10 = 0;
        }
        if ((*puVar11 & 0xfffffffe0000000) == 0) {
          uVar10 = uVar7;
        }
        if (uVar8 != uVar6) {
          uVar7 = uVar10;
        }
        puVar11 = puVar11 + 2;
      }
      uVar6 = local_158;
      if ((int)uVar7 == 0) {
        bVar4 = local_161 - 1;
        local_161 = bVar4;
      }
      else {
        bVar4 = (byte)local_148;
        uVar9 = (int)local_148 + 1;
        this->suffixLim = (u16)uVar9;
        local_148 = (ulong)uVar9;
      }
    }
    else {
      uVar9 = iVar12 - 1;
      bVar4 = (&local_160)[uVar9];
      (&local_160)[uVar9] = bVar4 + 1;
    }
    local_138[uVar8] = bVar4;
    this->symbols[bVar4].val.num = uVar1;
    this->symbols[bVar4].icl =
         (ulong)(iVar12 * -8 + 0x40U | (uint)bVar4 << 0x10 | (uint)uVar2 & 0xf0000000);
  }
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    uVar5 = 0x11ff;
    if ((this->byteCodes[lVar3] >> 8 & 1) != 0) {
      uVar5 = local_138[(ulong)this->byteCodes[lVar3] & 0xff] | 0x1000;
    }
    this->byteCodes[lVar3] = uVar5;
  }
  for (uVar6 = 0; uVar6 != 0x10000; uVar6 = uVar6 + 1) {
    uVar5 = this->shortCodes[uVar6];
    if ((uVar5 >> 8 & 1) == 0) {
      uVar5 = this->byteCodes[uVar6 & 0xff];
    }
    else {
      uVar5 = uVar5 & 0xf000 | (ushort)local_138[(byte)uVar5];
    }
    this->shortCodes[uVar6] = uVar5;
  }
  for (lVar3 = 0; lVar3 != 0x4000; lVar3 = lVar3 + 0x10) {
    uVar6 = *(ulong *)((long)&this->hashTab[0].icl + lVar3);
    if (uVar6 < 0xf1ff0000) {
      puVar11 = (u64 *)((long)&this->hashTab[0].icl + lVar3);
      uVar1 = this->symbols[local_138[uVar6 >> 0x10 & 0xff]].icl;
      *(anon_union_8_2_43acef4c_for_val *)(puVar11 + -1) =
           this->symbols[local_138[uVar6 >> 0x10 & 0xff]].val;
      *puVar11 = uVar1;
    }
  }
  return;
}

Assistant:

void finalize(u8 zeroTerminated) {
       assert(nSymbols <= 255);
       u8 newCode[256], rsum[8], byteLim = nSymbols - (lenHisto[0] - zeroTerminated);

       // compute running sum of code lengths (starting offsets for each length) 
       rsum[0] = byteLim; // 1-byte codes are highest
       rsum[1] = zeroTerminated;
       for(u32 i=1; i<7; i++)
          rsum[i+1] = rsum[i] + lenHisto[i];

       // determine the new code for each symbol, ordered by length (and splitting 2byte symbols into two classes around suffixLim)
       suffixLim = rsum[1];
       symbols[newCode[0] = 0] = symbols[256]; // keep symbol 0 in place (for zeroTerminated cases only)

       for(u32 i=zeroTerminated, j=rsum[2]; i<nSymbols; i++) {  
          Symbol s1 = symbols[FSST_CODE_BASE+i];
          u32 len = s1.length(), opt = (len == 2)*nSymbols;
          if (opt) {
              u16 first2 = s1.first2();
              for(u32 k=0; k<opt; k++) {  
                 Symbol s2 = symbols[FSST_CODE_BASE+k];
                 if (k != i && s2.length() > 1 && first2 == s2.first2()) // test if symbol k is a suffix of s
                    opt = 0;
              }
              newCode[i] = opt?suffixLim++:--j; // symbols without a larger suffix have a code < suffixLim 
          } else 
              newCode[i] = rsum[len-1]++;
          s1.set_code_len(newCode[i],len);
          symbols[newCode[i]] = s1; 
       }
       // renumber the codes in byteCodes[] 
       for(u32 i=0; i<256; i++) 
          if ((byteCodes[i] & FSST_CODE_MASK) >= FSST_CODE_BASE)
             byteCodes[i] = newCode[(u8) byteCodes[i]] + (1 << FSST_LEN_BITS);
          else 
             byteCodes[i] = 511 + (1 << FSST_LEN_BITS);
       
       // renumber the codes in shortCodes[] 
       for(u32 i=0; i<65536; i++)
          if ((shortCodes[i] & FSST_CODE_MASK) >= FSST_CODE_BASE)
             shortCodes[i] = newCode[(u8) shortCodes[i]] + (shortCodes[i] & (15 << FSST_LEN_BITS));
          else 
             shortCodes[i] = byteCodes[i&0xFF];

       // replace the symbols in the hash table
       for(u32 i=0; i<hashTabSize; i++)
          if (hashTab[i].icl < FSST_ICL_FREE)
             hashTab[i] = symbols[newCode[(u8) hashTab[i].code()]];
   }